

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

void gl4cts::GLSL420Pack::Utils::program::printShaderSource
               (shaderSource *source,MessageBuilder *log)

{
  ostringstream *this;
  char *__s;
  shaderSource *psVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  string line;
  ulong local_68;
  char *local_60;
  long local_58;
  char local_50;
  undefined7 uStack_4f;
  shaderSource *local_40;
  ulong local_38;
  
  this = &log->m_str;
  std::__ostream_insert<char,std::char_traits<char>>
            (&this->super_basic_ostream<char,_std::char_traits<char>_>,"Shader source.",0xe);
  if ((source->m_parts).
      super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (source->m_parts).
      super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_68 = 0;
    uVar4 = 0;
    local_40 = source;
    do {
      psVar1 = local_40;
      std::__ostream_insert<char,std::char_traits<char>>
                (&this->super_basic_ostream<char,_std::char_traits<char>_>,"\nLine||Part: ",0xd);
      local_38 = (ulong)((int)uVar4 + 1);
      std::ostream::_M_insert<unsigned_long>((ulong)this);
      std::__ostream_insert<char,std::char_traits<char>>
                (&this->super_basic_ostream<char,_std::char_traits<char>_>,"/",1);
      std::ostream::_M_insert<unsigned_long>((ulong)this);
      if (psVar1->m_use_lengths == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&this->super_basic_ostream<char,_std::char_traits<char>_>," Length: ",9);
        std::ostream::operator<<
                  (this,(psVar1->m_parts).
                        super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                        ._M_impl.super__Vector_impl_data._M_start[local_68].m_length);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (&this->super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
      __s = (psVar1->m_parts).
            super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
            ._M_impl.super__Vector_impl_data._M_start[local_68].m_code._M_dataplus._M_p;
      uVar4 = local_38;
      while (local_38 = uVar4, __s != (char *)0x0) {
        local_58 = 0;
        local_50 = '\0';
        local_60 = &local_50;
        pcVar2 = strchr(__s,10);
        if (pcVar2 == (char *)0x0) {
          strlen(__s);
          std::__cxx11::string::_M_replace((ulong)&local_60,0,(char *)0x0,(ulong)__s);
          pcVar2 = (char *)0x0;
        }
        else {
          pcVar2 = pcVar2 + 1;
          std::__cxx11::string::_M_replace((ulong)&local_60,0,(char *)0x0,(ulong)__s);
        }
        if (*__s != '\0') {
          *(undefined8 *)
           ((log->m_str).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]
            + 0x10 + (long)&(log->m_str).super_basic_ostream<char,_std::char_traits<char>_>.
                            _vptr_basic_ostream) = 4;
          std::ostream::_M_insert<unsigned_long>((ulong)this);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&this->super_basic_ostream<char,_std::char_traits<char>_>,"||",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&this->super_basic_ostream<char,_std::char_traits<char>_>,local_60,local_58);
        }
        __s = pcVar2;
        uVar4 = local_38;
        if (local_60 != &local_50) {
          operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
          uVar4 = local_38;
        }
      }
      local_68 = uVar4 & 0xffffffff;
      uVar3 = ((long)(local_40->m_parts).
                     super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_40->m_parts).
                     super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    } while (local_68 <= uVar3 && uVar3 - local_68 != 0);
  }
  return;
}

Assistant:

void Utils::program::printShaderSource(const shaderSource& source, tcu::MessageBuilder& log)
{
	GLuint line_number = 0;

	log << "Shader source.";

	for (GLuint i = 0; i < source.m_parts.size(); ++i)
	{
		log << "\nLine||Part: " << (i + 1) << "/" << source.m_parts.size();

		if (true == source.m_use_lengths)
		{
			log << " Length: " << source.m_parts[i].m_length;
		}

		log << "\n";

		const GLchar* part = source.m_parts[i].m_code.c_str();

		while (0 != part)
		{
			std::string   line;
			const GLchar* next_line = strchr(part, '\n');

			if (0 != next_line)
			{
				next_line += 1;
				line.assign(part, next_line - part);
			}
			else
			{
				line = part;
			}

			if (0 != *part)
			{
				log << std::setw(4) << line_number << "||" << line;
			}

			part = next_line;
			line_number += 1;
		}
	}
}